

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phrasalrule.h
# Opt level: O2

void jhu::thrax::printRhs<false>(ostream *out,PhrasalRule *rule)

{
  Span SVar1;
  AlignedSentencePair *pAVar2;
  pointer pbVar3;
  ostream *out_00;
  char *pcVar4;
  NT *pNVar5;
  Span SVar6;
  Span SVar7;
  long lVar8;
  Span SVar9;
  int iVar10;
  PhrasalRule *pPVar11;
  NT *pNVar12;
  NT *needle;
  int in_R8D;
  string_view nt;
  short local_ac;
  Rhs nts;
  
  pAVar2 = rule->sentence;
  pNVar12 = nts._M_elems;
  pPVar11 = rule;
  pNVar5 = pNVar12;
  for (lVar8 = 0xc; lVar8 != 0; lVar8 = lVar8 + -1) {
    pNVar5->span = (pPVar11->nts)._M_elems[0].span;
    pPVar11 = (PhrasalRule *)&(pPVar11->nts)._M_elems[0].label;
    pNVar5 = (NT *)&pNVar5->label;
  }
  pNVar5 = std::
           __find_if<jhu::thrax::NT*,__gnu_cxx::__ops::_Iter_pred<jhu::thrax::printRhs<false>(std::ostream&,jhu::thrax::PhrasalRule_const&)::_lambda(auto:1_const&)_1_>>
                     (pNVar12,&stack0xffffffffffffffd0);
  std::
  __sort<jhu::thrax::NT*,__gnu_cxx::__ops::_Iter_comp_iter<jhu::thrax::printRhs<false>(std::ostream&,jhu::thrax::PhrasalRule_const&)::_lambda(auto:1,auto:2)_1_>>
            (pNVar12,pNVar5);
  SVar1 = (rule->lhs).span.tgt;
  SVar6 = SVar1;
  SVar9 = nts._M_elems[0].span.tgt;
  do {
    SVar7 = (Span)((uint)SVar9 >> 0x10);
    do {
      while( true ) {
        needle = pNVar12;
        iVar10 = (int)SVar6.start;
        if ((int)SVar1 >> 0x10 <= iVar10) {
          return;
        }
        if ((needle != pNVar5) && (local_ac = SVar9.start, local_ac <= SVar6.start)) break;
        if (SVar1.start != iVar10) {
          std::operator<<(out,' ');
        }
        pbVar3 = (pAVar2->tgt).
                 super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        std::__ostream_insert<char,std::char_traits<char>>
                  (out,pbVar3[iVar10]._M_str,pbVar3[iVar10]._M_len);
        SVar6 = (Span)(iVar10 + 1);
        pNVar12 = needle;
      }
      if ((SVar1.start != iVar10) && ((int)SVar1 << 0x10 != (int)SVar9 << 0x10)) {
        std::operator<<(out,' ');
      }
      out_00 = (ostream *)(needle->label)._M_len;
      pcVar4 = (needle->label)._M_str;
      iVar10 = PhrasalRule::ntIndex(rule,needle);
      nt._M_str._0_4_ = iVar10;
      nt._M_len = (size_t)pcVar4;
      nt._M_str._4_4_ = 0;
      bracket((thrax *)out,out_00,nt,in_R8D);
      pNVar12 = needle + 1;
      SVar6 = SVar7;
    } while (pNVar5 <= pNVar12);
    SVar9 = needle[1].span.tgt;
  } while( true );
}

Assistant:

inline void printRhs(std::ostream& out, const PhrasalRule& rule) {
  const auto& s = rule.sentence;
  constexpr auto empty = [](const auto& nt) { return nt.span.empty(); };
  auto nts = rule.nts;
  auto it = std::find_if(nts.begin(), nts.end(), empty);
  if constexpr (!SourceSide) {
    std::sort(
        nts.begin(),
        it,
        [](auto a, auto b) { return a.span.tgt.start < b.span.tgt.start; });
  }
  auto nt = nts.begin();
  auto [start, end] = rule.lhs.span.get<SourceSide>();
  auto [ntStart, ntEnd] = nt->span.get<SourceSide>();
  for (auto i = start; i < end; i++) {
    if (nt == it || i < ntStart) {
      if (i != start) {
        out << ' ';
      }
      if constexpr (SourceSide) {
        out << s.src[i];
      } else {
        out << s.tgt[i];
      }
    } else {
      if (i != start && ntStart != start) {
        out << ' ';
      }
      bracket(out, nt->label, rule.ntIndex(*nt));
      i = ntEnd - 1;
      nt++;
      if (nt < it) {
        auto [s, e] = nt->span.get<SourceSide>();
        ntStart = s;
        ntEnd = e;
      }
    }
  }
}